

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::custom_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,long w,long h,long sx,long sy,
          function<void_(unsigned_int_&,_unsigned_int)> *param_9)

{
  long y_00;
  uint32_t __args_1;
  long x_00;
  long lVar1;
  long x_01;
  bool bVar2;
  uint32_t dc;
  Image *local_98;
  ssize_t h_local;
  ssize_t w_local;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  ssize_t local_48;
  ssize_t y_local;
  ssize_t x_local;
  
  w_local = w;
  if (w < 0) {
    w_local = source->width;
  }
  h_local = h;
  if (h < 0) {
    h_local = source->height;
  }
  local_98 = source;
  y_local = y;
  x_local = x;
  clamp_blit_dimensions(this,source,&x_local,&y_local,&w_local,&h_local,&sx,&sy);
  local_68 = sx;
  local_70 = sy;
  local_78 = x_local;
  local_80 = y_local;
  local_50 = 0;
  local_60 = w_local;
  if (w_local < 1) {
    local_60 = local_50;
  }
  local_58 = h_local;
  if (h_local < 1) {
    local_58 = local_50;
  }
  for (; local_50 != local_58; local_50 = local_50 + 1) {
    local_48 = local_70 + local_50;
    y_00 = local_80 + local_50;
    x_00 = local_68;
    lVar1 = local_60;
    x_01 = local_78;
    while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
      __args_1 = read_pixel(local_98,x_00,local_48);
      dc = read_pixel(this,x_01,y_00);
      ::std::function<void_(unsigned_int_&,_unsigned_int)>::operator()(param_9,&dc,__args_1);
      write_pixel(this,x_01,y_00,dc);
      x_00 = x_00 + 1;
      x_01 = x_01 + 1;
    }
  }
  return;
}

Assistant:

void Image::custom_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy,
    function<void(uint32_t&, uint32_t)> per_pixel_fn) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint32_t sc = source.read_pixel(sx + xx, sy + yy);
      uint32_t dc = this->read_pixel(x + xx, y + yy);
      per_pixel_fn(dc, sc);
      this->write_pixel(x + xx, y + yy, dc);
    }
  }
}